

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SizeT SPARC_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  SizeT in_RAX;
  int iVar4;
  int iVar5;
  uint uVar6;
  SizeT SVar7;
  byte bVar8;
  uint uVar9;
  
  if (3 < size) {
    in_RAX = 1;
    iVar4 = 0;
    iVar5 = 0;
    uVar6 = 0;
    do {
      if (data[in_RAX - 1] == '\x7f') {
        bVar8 = data[in_RAX];
        if (0xbf < bVar8) {
          SVar7 = (SizeT)(uVar6 | 1);
          goto LAB_00111b8f;
        }
      }
      else if ((data[in_RAX - 1] == '@') && (bVar8 = data[in_RAX], SVar7 = in_RAX, bVar8 < 0x40)) {
LAB_00111b8f:
        uVar9 = (uint)data[in_RAX + 2] | (uint)data[in_RAX + 1] << 8 | (uint)bVar8 << 0x10;
        uVar1 = iVar5 + uVar9 * 4;
        uVar3 = uVar1 >> 2;
        uVar9 = (int)(uVar9 * 0x200 + iVar4) >> 9 & 0x3fc00000;
        data[in_RAX - 1] = (byte)(uVar9 >> 0x18) | 0x40;
        data[SVar7] = (byte)(uVar3 >> 0x10) & 0x3f | (byte)(uVar9 >> 0x10);
        data[in_RAX + 1] = (Byte)(uVar1 >> 10);
        data[in_RAX + 2] = (Byte)uVar3;
      }
      uVar6 = uVar6 + 4;
      iVar2 = (int)in_RAX;
      in_RAX = in_RAX + 4;
      iVar5 = iVar5 + -4;
      iVar4 = iVar4 + -0x200;
    } while ((ulong)(iVar2 + 3) <= size - 4);
  }
  return in_RAX;
}

Assistant:

static SizeT SPARC_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  UInt32 i;
  if (size < 4)
    return 0;
  size -= 4;
  for (i = 0; i <= size; i += 4)
  {
    if ((data[i] == 0x40 && (data[i + 1] & 0xC0) == 0x00) ||
        (data[i] == 0x7F && (data[i + 1] & 0xC0) == 0xC0))
    {
      UInt32 src =
        ((UInt32)data[i + 0] << 24) |
        ((UInt32)data[i + 1] << 16) |
        ((UInt32)data[i + 2] << 8) |
        ((UInt32)data[i + 3]);
      UInt32 dest;
      
      src <<= 2;
      if (encoding)
        dest = ip + i + src;
      else
        dest = src - (ip + i);
      dest >>= 2;
      
      dest = (((0 - ((dest >> 22) & 1)) << 22) & 0x3FFFFFFF) | (dest & 0x3FFFFF) | 0x40000000;

      data[i + 0] = (Byte)(dest >> 24);
      data[i + 1] = (Byte)(dest >> 16);
      data[i + 2] = (Byte)(dest >> 8);
      data[i + 3] = (Byte)dest;
    }
  }
  return i;
}